

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void * startThread(void *obj)

{
  ThreadData *in_RDI;
  ThreadData *data;
  
  ThreadData::runInThread(in_RDI);
  if (in_RDI != (ThreadData *)0x0) {
    ThreadData::~ThreadData(in_RDI);
    operator_delete(in_RDI,0x50);
  }
  return (void *)0x0;
}

Assistant:

void* startThread(void* obj){
    ThreadData* data = static_cast<ThreadData*>(obj);
    data->runInThread();
    delete data;
    return nullptr;
}